

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O0

void __thiscall Potassco::SmodelsConvert::SmData::~SmData(SmData *this)

{
  bool bVar1;
  _Node_iterator_base<std::pair<const_unsigned_int,_const_char_*>,_false> this_00;
  pointer ppVar2;
  _Node_iterator<std::pair<const_unsigned_int,_const_char_*>,_false,_false> *in_RDI;
  iterator end;
  iterator it;
  unordered_map<unsigned_int,_const_char_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_char_*>_>_>
  *in_stack_ffffffffffffffd8;
  _Node_iterator_base<std::pair<const_unsigned_int,_const_char_*>,_false> local_18;
  
  flushStep((SmData *)
            end.super__Node_iterator_base<std::pair<const_unsigned_int,_const_char_*>,_false>._M_cur
           );
  this_00._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_const_char_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_char_*>_>_>
       ::begin(in_stack_ffffffffffffffd8);
  local_18._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_const_char_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_char_*>_>_>
       ::end(in_stack_ffffffffffffffd8);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      ((_Node_iterator_base<std::pair<const_unsigned_int,_const_char_*>,_false> *)
                       &stack0xfffffffffffffff0,&local_18);
    if (!bVar1) break;
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_const_char_*>,_false,_false>::operator->
                       ((_Node_iterator<std::pair<const_unsigned_int,_const_char_*>,_false,_false> *
                        )0x11e255);
    if (ppVar2->second != (char *)0x0) {
      operator_delete__(ppVar2->second);
    }
    std::__detail::_Node_iterator<std::pair<const_unsigned_int,_const_char_*>,_false,_false>::
    operator++(in_RDI);
  }
  std::
  vector<Potassco::SmodelsConvert::SmData::Symbol,_std::allocator<Potassco::SmodelsConvert::SmData::Symbol>_>
  ::~vector((vector<Potassco::SmodelsConvert::SmData::Symbol,_std::allocator<Potassco::SmodelsConvert::SmData::Symbol>_>
             *)this_00._M_cur);
  std::
  unordered_map<unsigned_int,_const_char_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_char_*>_>_>
  ::~unordered_map((unordered_map<unsigned_int,_const_char_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_char_*>_>_>
                    *)0x11e29c);
  std::
  vector<Potassco::SmodelsConvert::SmData::Heuristic,_std::allocator<Potassco::SmodelsConvert::SmData::Heuristic>_>
  ::~vector((vector<Potassco::SmodelsConvert::SmData::Heuristic,_std::allocator<Potassco::SmodelsConvert::SmData::Heuristic>_>
             *)this_00._M_cur);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00._M_cur);
  std::vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>::~vector
            ((vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_> *)this_00._M_cur
            );
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)this_00._M_cur);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00._M_cur);
  std::
  map<int,_std::vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>_>_>_>
  ::~map((map<int,_std::vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>_>_>_>
          *)0x11e2f6);
  std::
  vector<Potassco::SmodelsConvert::SmData::Atom,_std::allocator<Potassco::SmodelsConvert::SmData::Atom>_>
  ::~vector((vector<Potassco::SmodelsConvert::SmData::Atom,_std::allocator<Potassco::SmodelsConvert::SmData::Atom>_>
             *)this_00._M_cur);
  return;
}

Assistant:

~SmData() {
		flushStep();
		for (SymTab::iterator it = symTab_.begin(), end = symTab_.end(); it != end; ++it) {
			delete [] it->second;
		}
	}